

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_window_constraints.c
# Opt level: O1

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  long lVar13;
  long lVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  char *format;
  undefined8 uVar19;
  bool bVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  int ret_max_h;
  int ret_max_w;
  int ret_min_h;
  int ret_min_w;
  ALLEGRO_EVENT event;
  undefined4 local_90;
  undefined4 local_8c;
  undefined4 local_88;
  undefined4 local_84;
  long local_80;
  int local_78;
  undefined8 local_70;
  int local_58;
  
  cVar6 = al_install_system(0x5020700,atexit);
  if (cVar6 == '\0') goto LAB_00102878;
  al_install_keyboard();
  al_init_image_addon();
  al_init_font_addon();
  al_set_new_display_flags(0x50);
  lVar13 = al_create_display(0x280,0x1e0);
  if (lVar13 == 0) {
    format = "Unable to set any graphic mode\n";
  }
  else {
    local_80 = al_load_bitmap("data/mysha.pcx");
    if (local_80 == 0) {
      format = "Unable to load image\n";
    }
    else {
      lVar14 = al_load_font("data/a4_font.tga",0,0);
      if (lVar14 == 0) {
        format = "Failed to load a4_font.tga\n";
      }
      else {
        cVar6 = al_set_window_constraints(lVar13,0x280,0x1e0,800,600);
        if (cVar6 != '\0') {
          al_apply_window_constraints(lVar13,1);
          uVar15 = al_create_event_queue();
          uVar16 = al_get_display_event_source(lVar13);
          al_register_event_source(uVar15,uVar16);
          uVar16 = al_get_keyboard_event_source();
          al_register_event_source(uVar15,uVar16);
          bVar4 = true;
          bVar3 = true;
          bVar2 = true;
          bVar1 = true;
          bVar20 = true;
          do {
            if (bVar20) {
              cVar6 = al_is_event_queue_empty(uVar15);
              if (cVar6 != '\0') {
                al_map_rgb(0xff,0,0);
                al_clear_to_color();
                lVar5 = local_80;
                iVar7 = al_get_bitmap_width(local_80);
                iVar8 = al_get_bitmap_height(lVar5);
                iVar9 = al_get_display_width(lVar13);
                iVar10 = al_get_display_height(lVar13);
                uVar22 = 0;
                al_draw_scaled_bitmap
                          (0,0,(float)iVar7,(float)iVar8,0,0,(float)iVar9,(float)iVar10,lVar5,0);
                uVar21 = al_map_rgb(0xff,0xff,0xff);
                uVar11 = al_get_display_width(lVar13);
                uVar12 = al_get_display_height(lVar13);
                al_draw_textf(uVar21,uVar22,0,0,lVar14,0,"Resolution: %dx%d",uVar11,uVar12);
                cVar6 = al_get_window_constraints(lVar13,&local_84,&local_88,&local_8c,&local_90);
                if (cVar6 == '\0') {
                  format = "Unable to get window constraints\n";
                  goto LAB_00102871;
                }
                uVar11 = al_map_rgb(0xff,0xff,0xff);
                iVar7 = al_get_font_line_height(lVar14);
                bVar20 = false;
                al_draw_textf(uVar11,uVar22,0,(float)iVar7,lVar14,0,
                              "Min Width: %d, Min Height: %d, Max Width: %d, Max Height: %d",
                              local_84,local_88,local_8c,local_90);
                uVar11 = al_map_rgb(0xff,0xff,0xff);
                iVar7 = al_get_font_line_height(lVar14);
                al_draw_textf(uVar11,uVar22,0,(float)(iVar7 * 2),lVar14,0,
                              "Toggle Restriction: Min Width: Z, Min Height: X, Max Width: C, Max Height: V"
                             );
                al_flip_display();
              }
            }
            al_wait_for_event(uVar15);
            if (local_78 == 0x29) {
              al_acknowledge_resize(local_70);
              bVar20 = true;
            }
            if (local_78 == 0x28) {
              bVar20 = true;
            }
            if (local_78 == 10) {
              if (local_58 < 0x18) {
                if (local_58 == 3) {
                  bVar3 = (bool)(bVar3 ^ 1);
                }
                else if (local_58 == 0x16) {
                  bVar4 = (bool)(bVar4 ^ 1);
                }
              }
              else if (local_58 == 0x18) {
                bVar2 = (bool)(bVar2 ^ 1);
              }
              else if (local_58 == 0x1a) {
                bVar1 = (bool)(bVar1 ^ 1);
              }
              else if (local_58 == 0x3b) break;
              uVar16 = 0;
              if (bVar1) {
                uVar16 = 0x280;
              }
              uVar18 = 0;
              if (bVar2) {
                uVar18 = 0x1e0;
              }
              uVar17 = 0;
              if (bVar3) {
                uVar17 = 800;
              }
              uVar19 = 0;
              if (bVar4) {
                uVar19 = 600;
              }
              cVar6 = al_set_window_constraints(lVar13,uVar16,uVar18,uVar17,uVar19);
              if (cVar6 == '\0') goto LAB_00102861;
              al_apply_window_constraints(lVar13);
              bVar20 = true;
            }
          } while (local_78 != 0x2a);
          al_destroy_bitmap(local_80);
          al_destroy_display(lVar13);
          return 0;
        }
LAB_00102861:
        format = "Unable to set window constraints.\n";
      }
    }
  }
LAB_00102871:
  do {
    abort_example(format);
LAB_00102878:
    format = "Could not init Allegro.\n";
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_BITMAP *bmp;
   ALLEGRO_FONT *f;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_EVENT event;
   bool redraw;
   int min_w, min_h, max_w, max_h;
   int ret_min_w, ret_min_h, ret_max_w, ret_max_h;
   bool constr_min_w, constr_min_h, constr_max_w, constr_max_h;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_install_keyboard();
   al_init_image_addon();
   al_init_font_addon();

   al_set_new_display_flags(ALLEGRO_RESIZABLE |
      ALLEGRO_GENERATE_EXPOSE_EVENTS);
   display = al_create_display(640, 480);
   if (!display) {
      abort_example("Unable to set any graphic mode\n");
   }

   bmp = al_load_bitmap("data/mysha.pcx");
   if (!bmp) {
      abort_example("Unable to load image\n");
   }

   f = al_load_font("data/a4_font.tga", 0, 0);
   if (!f) {
      abort_example("Failed to load a4_font.tga\n");
   }

   min_w = 640;
   min_h = 480;
   max_w = 800;
   max_h = 600;
   constr_min_w = constr_min_h = constr_max_w = constr_max_h = true;

   if (!al_set_window_constraints(
          display,
          constr_min_w ? min_w : 0,
          constr_min_h ? min_h : 0,
          constr_max_w ? max_w : 0,
          constr_max_h ? max_h : 0)) {
      abort_example("Unable to set window constraints.\n");
   }

   al_apply_window_constraints(display, true);

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_keyboard_event_source());

   redraw = true;
   while (true) {
      if (redraw && al_is_event_queue_empty(queue)) {
         al_clear_to_color(al_map_rgb(255, 0, 0));
         al_draw_scaled_bitmap(bmp,
            0, 0, al_get_bitmap_width(bmp), al_get_bitmap_height(bmp),
            0, 0, al_get_display_width(display), al_get_display_height(display),
            0);

         /* Display screen resolution */
         al_draw_textf(f, al_map_rgb(255, 255, 255), 0, 0, 0,
            "Resolution: %dx%d",
            al_get_display_width(display), al_get_display_height(display));

         if (!al_get_window_constraints(display, &ret_min_w, &ret_min_h,
               &ret_max_w, &ret_max_h))
         {
            abort_example("Unable to get window constraints\n");
         }

         al_draw_textf(f, al_map_rgb(255, 255, 255), 0,
            al_get_font_line_height(f), 0,
            "Min Width: %d, Min Height: %d, Max Width: %d, Max Height: %d",
            ret_min_w, ret_min_h, ret_max_w, ret_max_h);

         al_draw_textf(f, al_map_rgb(255, 255, 255), 0,
            al_get_font_line_height(f) * 2,0,
            "Toggle Restriction: Min Width: Z, Min Height: X, Max Width: C, Max Height: V");

         al_flip_display();
         redraw = false;
      }

      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_RESIZE) {
         al_acknowledge_resize(event.display.source);
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_EXPOSE) {
         redraw = true;
      }
      if (event.type == ALLEGRO_EVENT_KEY_DOWN) {
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE) {
            break;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_Z) {
            constr_min_w = ! constr_min_w;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_X) {
            constr_min_h = ! constr_min_h;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_C) {
            constr_max_w = ! constr_max_w;
         }
         else if (event.keyboard.keycode == ALLEGRO_KEY_V) {
            constr_max_h = ! constr_max_h;
         }

         redraw = true;

         if (!al_set_window_constraints(display,
               constr_min_w ? min_w : 0,
               constr_min_h ? min_h : 0,
               constr_max_w ? max_w : 0,
               constr_max_h ? max_h : 0)) {
            abort_example("Unable to set window constraints.\n");
         }
         al_apply_window_constraints(display, true);
      }
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
   }

   al_destroy_bitmap(bmp);
   al_destroy_display(display);

   return 0;
}